

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void finish(log_multi *b)

{
  node *pnVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 8;
  for (uVar2 = 0; pnVar1 = (b->nodes)._begin,
      uVar2 < (ulong)(((long)(b->nodes)._end - (long)pnVar1) / 0x58); uVar2 = uVar2 + 1) {
    v_array<node_pred>::delete_v((v_array<node_pred> *)((long)&pnVar1->parent + lVar3));
    lVar3 = lVar3 + 0x58;
  }
  v_array<node>::delete_v(&b->nodes);
  return;
}

Assistant:

void finish(log_multi& b)
{
  // save_node_stats(b);
  for (size_t i = 0; i < b.nodes.size(); i++) b.nodes[i].preds.delete_v();
  b.nodes.delete_v();
}